

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.h
# Opt level: O2

OLECHAR * __thiscall Js::CharClassifier::SkipWhiteSpace(CharClassifier *this,LPCOLESTR psz)

{
  OLECHAR OVar1;
  bool bVar2;
  OLECHAR *pOVar3;
  
  OVar1 = *psz;
  if (OVar1 != L'\0') {
    bVar2 = IsWhiteSpace(this,(uint)(ushort)OVar1);
    if (bVar2) {
LAB_00a28841:
      pOVar3 = (*this->skipWhiteSpaceFunc)(psz,this);
      return pOVar3;
    }
    if (this->skipWhiteSpaceFunc == SkipWhiteSpaceSurrogate) {
      bVar2 = NumberUtilities::IsSurrogateLowerPart((uint)(ushort)OVar1);
      if (bVar2) goto LAB_00a28841;
    }
  }
  return psz;
}

Assistant:

const OLECHAR* SkipWhiteSpace(LPCOLESTR psz) const
        {
            // Fast path for the case in which first character is not space
            char16 firstChar = *psz;
            if (firstChar == 0)
            {
                return psz;
            }
            if (!this->IsWhiteSpace(firstChar) &&
                (skipWhiteSpaceFunc != &SkipWhiteSpaceSurrogate
                || !Js::NumberUtilities::IsSurrogateLowerPart(firstChar)))
            {
                return psz;
            }
            return skipWhiteSpaceFunc(psz, this);
        }